

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstExpr.cpp
# Opt level: O0

void TestConstExpr::ConstCastTestT<unsigned_char>(void)

{
  int iVar1;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  undefined4 uVar2;
  SafeInt<unsigned_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  local_23;
  uchar local_22;
  uchar local_21;
  uchar local_20;
  uchar local_1f;
  uchar local_1e;
  uchar local_1d;
  uchar local_1c;
  uchar local_1b;
  uchar local_1a;
  uchar local_19;
  uchar local_18;
  uchar local_17;
  uchar local_16;
  uchar local_15;
  SafeInt local_1;
  
  if (ConstCastTestT<unsigned_char>()::b == '\0') {
    iVar1 = __cxa_guard_acquire(&ConstCastTestT<unsigned_char>()::b);
    if (iVar1 != 0) {
      local_1 = (SafeInt)ConstSafeInt<unsigned_char>();
      ConstCastTestT<unsigned_char>::b = ::SafeInt::operator_cast_to_bool(&local_1);
      __cxa_guard_release(&ConstCastTestT<unsigned_char>()::b);
    }
  }
  if (ConstCastTestT<unsigned_char>()::w == '\0') {
    iVar1 = __cxa_guard_acquire(&ConstCastTestT<unsigned_char>()::w);
    if (iVar1 != 0) {
      local_15 = (uchar)ConstSafeInt<unsigned_char>();
      ConstCastTestT<unsigned_char>::w =
           ::SafeInt::operator_cast_to_wchar_t
                     ((SafeInt<unsigned_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                       *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
      __cxa_guard_release(&ConstCastTestT<unsigned_char>()::w);
    }
  }
  if (ConstCastTestT<unsigned_char>()::c == '\0') {
    iVar1 = __cxa_guard_acquire(&ConstCastTestT<unsigned_char>()::c);
    if (iVar1 != 0) {
      local_16 = (uchar)ConstSafeInt<unsigned_char>();
      ConstCastTestT<unsigned_char>::c =
           ::SafeInt::operator_cast_to_char
                     ((SafeInt<unsigned_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                       *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
      __cxa_guard_release(&ConstCastTestT<unsigned_char>()::c);
    }
  }
  if (ConstCastTestT<unsigned_char>()::sc == '\0') {
    iVar1 = __cxa_guard_acquire(&ConstCastTestT<unsigned_char>()::sc);
    if (iVar1 != 0) {
      local_17 = (uchar)ConstSafeInt<unsigned_char>();
      ConstCastTestT<unsigned_char>::sc =
           ::SafeInt::operator_cast_to_signed_char
                     ((SafeInt<unsigned_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                       *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
      __cxa_guard_release(&ConstCastTestT<unsigned_char>()::sc);
    }
  }
  if (ConstCastTestT<unsigned_char>()::uc == '\0') {
    iVar1 = __cxa_guard_acquire(&ConstCastTestT<unsigned_char>()::uc);
    if (iVar1 != 0) {
      local_18 = (uchar)ConstSafeInt<unsigned_char>();
      ConstCastTestT<unsigned_char>::uc =
           ::SafeInt::operator_cast_to_unsigned_char
                     ((SafeInt<unsigned_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                       *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
      __cxa_guard_release(&ConstCastTestT<unsigned_char>()::uc);
    }
  }
  if (ConstCastTestT<unsigned_char>()::s == '\0') {
    iVar1 = __cxa_guard_acquire(&ConstCastTestT<unsigned_char>()::s);
    if (iVar1 != 0) {
      local_19 = (uchar)ConstSafeInt<unsigned_char>();
      ConstCastTestT<unsigned_char>::s =
           ::SafeInt::operator_cast_to_short
                     ((SafeInt<unsigned_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                       *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
      __cxa_guard_release(&ConstCastTestT<unsigned_char>()::s);
    }
  }
  if (ConstCastTestT<unsigned_char>()::us == '\0') {
    iVar1 = __cxa_guard_acquire(&ConstCastTestT<unsigned_char>()::us);
    if (iVar1 != 0) {
      local_1a = (uchar)ConstSafeInt<unsigned_char>();
      ConstCastTestT<unsigned_char>::us =
           ::SafeInt::operator_cast_to_unsigned_short
                     ((SafeInt<unsigned_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                       *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
      __cxa_guard_release(&ConstCastTestT<unsigned_char>()::us);
    }
  }
  if (ConstCastTestT<unsigned_char>()::i == '\0') {
    iVar1 = __cxa_guard_acquire(&ConstCastTestT<unsigned_char>()::i);
    if (iVar1 != 0) {
      local_1b = (uchar)ConstSafeInt<unsigned_char>();
      ConstCastTestT<unsigned_char>::i =
           ::SafeInt::operator_cast_to_int
                     ((SafeInt<unsigned_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                       *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
      __cxa_guard_release(&ConstCastTestT<unsigned_char>()::i);
    }
  }
  if (ConstCastTestT<unsigned_char>()::ui == '\0') {
    iVar1 = __cxa_guard_acquire(&ConstCastTestT<unsigned_char>()::ui);
    if (iVar1 != 0) {
      local_1c = (uchar)ConstSafeInt<unsigned_char>();
      ConstCastTestT<unsigned_char>::ui =
           ::SafeInt::operator_cast_to_unsigned_int
                     ((SafeInt<unsigned_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                       *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
      __cxa_guard_release(&ConstCastTestT<unsigned_char>()::ui);
    }
  }
  if (ConstCastTestT<unsigned_char>()::l == '\0') {
    iVar1 = __cxa_guard_acquire(&ConstCastTestT<unsigned_char>()::l);
    if (iVar1 != 0) {
      local_1d = (uchar)ConstSafeInt<unsigned_char>();
      ConstCastTestT<unsigned_char>::l =
           ::SafeInt::operator_cast_to_long
                     ((SafeInt<unsigned_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                       *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
      __cxa_guard_release(&ConstCastTestT<unsigned_char>()::l);
    }
  }
  if (ConstCastTestT<unsigned_char>()::ul == '\0') {
    iVar1 = __cxa_guard_acquire(&ConstCastTestT<unsigned_char>()::ul);
    if (iVar1 != 0) {
      local_1e = (uchar)ConstSafeInt<unsigned_char>();
      ConstCastTestT<unsigned_char>::ul =
           ::SafeInt::operator_cast_to_unsigned_long
                     ((SafeInt<unsigned_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                       *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
      __cxa_guard_release(&ConstCastTestT<unsigned_char>()::ul);
    }
  }
  if (ConstCastTestT<unsigned_char>()::ll == '\0') {
    iVar1 = __cxa_guard_acquire(&ConstCastTestT<unsigned_char>()::ll);
    if (iVar1 != 0) {
      local_1f = (uchar)ConstSafeInt<unsigned_char>();
      ConstCastTestT<unsigned_char>::ll =
           ::SafeInt::operator_cast_to_long_long
                     ((SafeInt<unsigned_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                       *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
      __cxa_guard_release(&ConstCastTestT<unsigned_char>()::ll);
    }
  }
  if (ConstCastTestT<unsigned_char>()::ull == '\0') {
    iVar1 = __cxa_guard_acquire(&ConstCastTestT<unsigned_char>()::ull);
    if (iVar1 != 0) {
      local_20 = (uchar)ConstSafeInt<unsigned_char>();
      ConstCastTestT<unsigned_char>::ull =
           ::SafeInt::operator_cast_to_unsigned_long_long
                     ((SafeInt<unsigned_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                       *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
      __cxa_guard_release(&ConstCastTestT<unsigned_char>()::ull);
    }
  }
  if (ConstCastTestT<unsigned_char>()::st == '\0') {
    iVar1 = __cxa_guard_acquire(&ConstCastTestT<unsigned_char>()::st);
    if (iVar1 != 0) {
      local_21 = (uchar)ConstSafeInt<unsigned_char>();
      ConstCastTestT<unsigned_char>::st =
           ::SafeInt::operator_cast_to_unsigned_long
                     ((SafeInt<unsigned_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                       *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
      __cxa_guard_release(&ConstCastTestT<unsigned_char>()::st);
    }
  }
  if (ConstCastTestT<unsigned_char>()::pt == '\0') {
    iVar1 = __cxa_guard_acquire(&ConstCastTestT<unsigned_char>()::pt);
    if (iVar1 != 0) {
      local_22 = (uchar)ConstSafeInt<unsigned_char>();
      ConstCastTestT<unsigned_char>::pt =
           ::SafeInt::operator_cast_to_long
                     ((SafeInt<unsigned_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                       *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
      __cxa_guard_release(&ConstCastTestT<unsigned_char>()::pt);
    }
  }
  if (ConstCastTestT<unsigned_char>()::pl == '\0') {
    iVar1 = __cxa_guard_acquire(&ConstCastTestT<unsigned_char>()::pl);
    if (iVar1 != 0) {
      local_23 = ConstSafeInt<unsigned_char>();
      uVar2 = CONCAT13(local_23.m_int,(int3)in_stack_ffffffffffffff54);
      SafeInt<unsigned_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
      ::operator+(&local_23);
      ConstCastTestT<unsigned_char>::pl =
           ::SafeInt::operator_cast_to_int
                     ((SafeInt<unsigned_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                       *)CONCAT44(uVar2,in_stack_ffffffffffffff50));
      __cxa_guard_release(&ConstCastTestT<unsigned_char>()::pl);
    }
  }
  return;
}

Assistant:

void ConstCastTestT()
	{
		static const bool b = ConstSafeInt<T>();
		static const wchar_t w = ConstSafeInt<T>();
		static const char c = ConstSafeInt<T>();
		static const signed char sc = ConstSafeInt<T>();
		static const unsigned char uc = ConstSafeInt<T>();
		static const signed short s = ConstSafeInt<T>();
		static const unsigned short us = ConstSafeInt<T>();
		static const signed int i = ConstSafeInt<T>();
		static const unsigned int ui = ConstSafeInt<T>();
		static const signed long l = ConstSafeInt<T>();
		static const unsigned long ul = ConstSafeInt<T>();
		static const signed long long ll = ConstSafeInt<T>();
		static const unsigned long long ull = ConstSafeInt<T>();
		static const size_t st = ConstSafeInt<T>();
		static const ptrdiff_t pt = ConstSafeInt<T>();

		// Also catch the useless unary + operator
		static const int pl = +ConstSafeInt<T>();
	}